

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

void __thiscall Ym2612_Impl::write1(Ym2612_Impl *this,int opn_addr,int data)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_stack_00000020;
  int in_stack_00000024;
  Ym2612_Impl *in_stack_00000028;
  
  if ((0x2f < in_ESI) && (*(int *)(in_RDI + 0x13e8 + (long)in_ESI * 4) != in_EDX)) {
    *(int *)(in_RDI + 0x13e8 + (long)in_ESI * 4) = in_EDX;
    if (in_ESI < 0xa0) {
      SLOT_SET(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
    else {
      CHANNEL_SET(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
  }
  return;
}

Assistant:

inline void Ym2612_Impl::write1( int opn_addr, int data )
{
	assert( (unsigned) data <= 0xFF );
	
	if ( opn_addr >= 0x30 && YM2612.REG [1] [opn_addr] != data )
	{
		YM2612.REG [1] [opn_addr] = data;

		if ( opn_addr < 0xA0 )
			SLOT_SET( opn_addr + 0x100, data );
		else
			CHANNEL_SET( opn_addr + 0x100, data );
	}
}